

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-utils.cpp
# Opt level: O2

void setupStackTraceOnError(int argc,char **argv)

{
  PrettyStackTraceProgram X;
  PrettyStackTraceProgram aPStack_38 [32];
  
  llvm::sys::PrintStackTraceOnErrorSignal((StringRef)ZEXT816(0),false);
  llvm::PrettyStackTraceProgram::PrettyStackTraceProgram(aPStack_38,argc,argv);
  llvm::PrettyStackTraceEntry::~PrettyStackTraceEntry((PrettyStackTraceEntry *)aPStack_38);
  return;
}

Assistant:

void setupStackTraceOnError(int argc, char *argv[]) {
#if LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 9
    llvm::sys::PrintStackTraceOnErrorSignal();
#else
    llvm::sys::PrintStackTraceOnErrorSignal(llvm::StringRef());
#endif
    llvm::PrettyStackTraceProgram X(argc, argv);
}